

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O3

void secp256k1_gej_rescale(secp256k1_gej *r,secp256k1_fe *s)

{
  secp256k1_fe *r_00;
  long lVar1;
  ulong uVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  ulong uVar6;
  long lVar7;
  sbyte sVar8;
  ulong uVar9;
  secp256k1_scalar *b;
  uint uVar10;
  secp256k1_gej *r_01;
  ulong uVar11;
  secp256k1_ge *r_02;
  uint uVar12;
  ulong uVar13;
  bool bVar14;
  bool bVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  secp256k1_fe zz;
  int iStack_1d0;
  uint uStack_164;
  undefined1 auStack_160 [16];
  undefined1 auStack_150 [16];
  undefined1 auStack_140 [16];
  undefined1 auStack_130 [16];
  undefined1 auStack_120 [16];
  undefined1 auStack_110 [16];
  uint64_t uStack_100;
  undefined8 uStack_f8;
  secp256k1_ge sStack_f0;
  secp256k1_gej *psStack_88;
  undefined8 uStack_80;
  secp256k1_fe local_50;
  
  secp256k1_gej_verify(r);
  secp256k1_fe_verify(s);
  secp256k1_fe_verify(s);
  uVar6 = (s->n[4] >> 0x30) * 0x1000003d1 + s->n[0];
  if (((uVar6 & 0xfffffffffffff) == 0xffffefffffc2f) || ((uVar6 & 0xfffffffffffff) == 0)) {
    uVar9 = (uVar6 >> 0x34) + s->n[1];
    r_01 = (secp256k1_gej *)((uVar9 >> 0x34) + s->n[2]);
    uVar11 = ((ulong)r_01 >> 0x34) + s->n[3];
    uVar13 = (uVar11 >> 0x34) + (s->n[4] & 0xffffffffffff);
    if ((((uVar9 | uVar6 | (ulong)r_01 | uVar11) & 0xfffffffffffff) == 0 && uVar13 == 0) ||
       (((uVar6 | 0x1000003d0) & uVar9 & (ulong)r_01 & uVar11 & (uVar13 ^ 0xf000000000000)) ==
        0xfffffffffffff)) {
      secp256k1_gej_rescale_cold_1();
      uStack_80 = 0x1000003d0;
      auStack_160 = (undefined1  [16])0x0;
      auStack_150 = (undefined1  [16])0x0;
      auStack_140 = (undefined1  [16])0x0;
      auStack_130 = (undefined1  [16])0x0;
      psStack_88 = r;
      secp256k1_scalar_add(&uStack_164,(secp256k1_scalar *)(uVar11 + 4),b);
      secp256k1_scalar_verify((secp256k1_scalar *)(ulong)uStack_164);
      iStack_1d0 = 1;
      bVar15 = false;
      while( true ) {
        r_02 = &sStack_f0;
        sVar8 = 0;
        uVar10 = 0;
        iVar5 = iStack_1d0;
        bVar4 = true;
        do {
          bVar14 = bVar4;
          bVar3 = (byte)iVar5 & 0x1f;
          uVar10 = (uStack_164 >> bVar3 | uStack_164 << 0x20 - bVar3) << sVar8 ^
                   uVar10 & (-2 << sVar8 | 0xfffffffeU >> 0x20 - sVar8);
          iVar5 = iVar5 + 2;
          sVar8 = 1;
          bVar4 = false;
        } while (bVar14);
        uVar6 = 0;
        bVar4 = true;
        do {
          bVar14 = bVar4;
          uVar12 = (uint)(uVar6 == ((uVar10 ^ uVar10 >> 1) & 1));
          uVar13 = (ulong)((long)r_02 << 3) >> 0x33;
          uVar2 = (((long)r_02 << 3 | (ulong)r_02 >> 0x3d) << 0xd | uVar13) >> 3;
          uVar9 = uVar2 << 0x33;
          lVar1 = (long)(int)uVar12 + -1;
          lVar7 = -(long)(int)uVar12;
          auVar16._8_4_ = (int)lVar1;
          auVar16._0_8_ = lVar1;
          auVar16._12_4_ = (int)((ulong)lVar1 >> 0x20);
          auVar18._8_4_ = (int)lVar7;
          auVar18._0_8_ = lVar7;
          auVar18._12_4_ = (int)((ulong)lVar7 >> 0x20);
          auStack_160 = *(undefined1 (*) [16])secp256k1_ecmult_gen_prec_table[0][uVar6].x.n &
                        auVar18 | auStack_160 & auVar16;
          auStack_150 = auVar18 & *(undefined1 (*) [16])
                                   (secp256k1_ecmult_gen_prec_table[0][uVar6].x.n + 2) |
                        auVar16 & auStack_150;
          uVar13 = (uVar9 | (uVar13 << 0x3d | uVar2) >> 0xd) << 3;
          uVar2 = uVar13 >> 0x33;
          uVar9 = ((uVar13 | uVar9 >> 0x3d) << 0xd | uVar2) >> 3;
          r_02 = (secp256k1_ge *)(uVar9 << 0x33 | (uVar2 << 0x3d | uVar9) >> 0xd);
          lVar1 = (long)(int)uVar12 + -1;
          lVar7 = -(long)(int)uVar12;
          auVar17._8_4_ = (int)lVar1;
          auVar17._0_8_ = lVar1;
          auVar17._12_4_ = (int)((ulong)lVar1 >> 0x20);
          auVar19._8_4_ = (int)lVar7;
          auVar19._0_8_ = lVar7;
          auVar19._12_4_ = (int)((ulong)lVar7 >> 0x20);
          auStack_140 = *(undefined1 (*) [16])secp256k1_ecmult_gen_prec_table[0][uVar6].y.n &
                        auVar19 | auStack_140 & auVar17;
          auStack_130 = auVar19 & *(undefined1 (*) [16])
                                   (secp256k1_ecmult_gen_prec_table[0][uVar6].y.n + 2) |
                        auVar17 & auStack_130;
          uVar6 = 1;
          bVar4 = false;
        } while (bVar14);
        secp256k1_ge_from_storage(r_02,(secp256k1_ge_storage *)auStack_160);
        secp256k1_fe_verify(&sStack_f0.y);
        secp256k1_fe_verify_magnitude((secp256k1_fe *)(ulong)(uint)sStack_f0.y.magnitude,1);
        auStack_120._8_8_ = 0x3ffffffffffffc - sStack_f0.y.n[1];
        auStack_120._0_8_ = 0x3ffffbfffff0bc - sStack_f0.y.n[0];
        auStack_110._8_8_ = 0x3ffffffffffffc - sStack_f0.y.n[3];
        auStack_110._0_8_ = 0x3ffffffffffffc - sStack_f0.y.n[2];
        uStack_100 = 0x3fffffffffffc - sStack_f0.y.n[4];
        uStack_f8._0_4_ = 2;
        uStack_f8._4_4_ = 0;
        secp256k1_fe_verify((secp256k1_fe *)auStack_120);
        secp256k1_fe_cmov(&sStack_f0.y,(secp256k1_fe *)auStack_120,uVar10 >> 1 & 1);
        if (bVar15) {
          secp256k1_gej_add_ge(r_01,r_01,&sStack_f0);
        }
        else {
          secp256k1_gej_set_ge(r_01,&sStack_f0);
          secp256k1_gej_rescale(r_01,(secp256k1_fe *)(uVar11 + 0x70));
        }
        bVar15 = iStack_1d0 == 0;
        iStack_1d0 = iStack_1d0 + -1;
        if (bVar15) break;
        secp256k1_gej_double(r_01,r_01);
        bVar15 = true;
      }
      secp256k1_gej_add_ge(r_01,r_01,(secp256k1_ge *)(uVar11 + 8));
      uStack_f8._0_4_ = 0;
      uStack_f8._4_4_ = 1;
      auStack_120 = (undefined1  [16])0x0;
      auStack_110 = (undefined1  [16])0x0;
      uStack_100 = 0;
      secp256k1_fe_verify((secp256k1_fe *)auStack_120);
      secp256k1_ge_clear(&sStack_f0);
      return;
    }
  }
  secp256k1_fe_sqr(&local_50,s);
  secp256k1_fe_mul(&r->x,&r->x,&local_50);
  r_00 = &r->y;
  secp256k1_fe_mul(r_00,r_00,&local_50);
  secp256k1_fe_mul(r_00,r_00,s);
  secp256k1_fe_mul(&r->z,&r->z,s);
  secp256k1_gej_verify(r);
  return;
}

Assistant:

static void secp256k1_gej_rescale(secp256k1_gej *r, const secp256k1_fe *s) {
    /* Operations: 4 mul, 1 sqr */
    secp256k1_fe zz;
    SECP256K1_GEJ_VERIFY(r);
    SECP256K1_FE_VERIFY(s);
    VERIFY_CHECK(!secp256k1_fe_normalizes_to_zero_var(s));

    secp256k1_fe_sqr(&zz, s);
    secp256k1_fe_mul(&r->x, &r->x, &zz);                /* r->x *= s^2 */
    secp256k1_fe_mul(&r->y, &r->y, &zz);
    secp256k1_fe_mul(&r->y, &r->y, s);                  /* r->y *= s^3 */
    secp256k1_fe_mul(&r->z, &r->z, s);                  /* r->z *= s   */

    SECP256K1_GEJ_VERIFY(r);
}